

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

void addPoint(uint *vcount,btVector3 *p,btScalar x,btScalar y,btScalar z)

{
  btVector3 *this;
  btScalar *pbVar1;
  long in_RSI;
  uint *in_RDI;
  btScalar in_XMM0_Da;
  btScalar in_XMM1_Da;
  btScalar in_XMM2_Da;
  btVector3 *dest;
  
  this = (btVector3 *)(in_RSI + (ulong)*in_RDI * 0x10);
  pbVar1 = btVector3::operator_cast_to_float_(this);
  *pbVar1 = in_XMM0_Da;
  pbVar1 = btVector3::operator_cast_to_float_(this);
  pbVar1[1] = in_XMM1_Da;
  pbVar1 = btVector3::operator_cast_to_float_(this);
  pbVar1[2] = in_XMM2_Da;
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

static void addPoint(unsigned int &vcount,btVector3 *p,btScalar x,btScalar y,btScalar z)
{
	// XXX, might be broken
	btVector3& dest = p[vcount];
	dest[0] = x;
	dest[1] = y;
	dest[2] = z;
	vcount++;
}